

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O0

void lj_meta_for(lua_State *L,TValue *o)

{
  int iVar1;
  TValue *pTVar2;
  bool bVar3;
  TValue *o_local;
  lua_State *L_local;
  
  bVar3 = true;
  if ((0xfffffff2 < (uint)((int)(o->field_4).it >> 0xf)) &&
     (bVar3 = false, (int)(o->field_4).it >> 0xf == -5)) {
    iVar1 = lj_strscan_num((GCstr *)(o->u64 & 0x7fffffffffff),o);
    bVar3 = iVar1 != 0;
  }
  if (!bVar3) {
    lj_err_msg(L,LJ_ERR_FORINIT);
  }
  pTVar2 = o + 1;
  bVar3 = true;
  if ((0xfffffff2 < (uint)((int)(pTVar2->field_4).it >> 0xf)) &&
     (bVar3 = false, (int)(pTVar2->field_4).it >> 0xf == -5)) {
    iVar1 = lj_strscan_num((GCstr *)(pTVar2->u64 & 0x7fffffffffff),pTVar2);
    bVar3 = iVar1 != 0;
  }
  if (bVar3) {
    pTVar2 = o + 2;
    bVar3 = true;
    if ((0xfffffff2 < (uint)((int)(pTVar2->field_4).it >> 0xf)) &&
       (bVar3 = false, (int)(pTVar2->field_4).it >> 0xf == -5)) {
      iVar1 = lj_strscan_num((GCstr *)(pTVar2->u64 & 0x7fffffffffff),pTVar2);
      bVar3 = iVar1 != 0;
    }
    if (bVar3) {
      return;
    }
    lj_err_msg(L,LJ_ERR_FORSTEP);
  }
  lj_err_msg(L,LJ_ERR_FORLIM);
}

Assistant:

void LJ_FASTCALL lj_meta_for(lua_State *L, TValue *o)
{
  if (!lj_strscan_numberobj(o)) lj_err_msg(L, LJ_ERR_FORINIT);
  if (!lj_strscan_numberobj(o+1)) lj_err_msg(L, LJ_ERR_FORLIM);
  if (!lj_strscan_numberobj(o+2)) lj_err_msg(L, LJ_ERR_FORSTEP);
  if (LJ_DUALNUM) {
    /* Ensure all slots are integers or all slots are numbers. */
    int32_t k[3];
    int nint = 0;
    ptrdiff_t i;
    for (i = 0; i <= 2; i++) {
      if (tvisint(o+i)) {
	k[i] = intV(o+i); nint++;
      } else {
	k[i] = lj_num2int(numV(o+i)); nint += ((lua_Number)k[i] == numV(o+i));
      }
    }
    if (nint == 3) {  /* Narrow to integers. */
      setintV(o, k[0]);
      setintV(o+1, k[1]);
      setintV(o+2, k[2]);
    } else if (nint != 0) {  /* Widen to numbers. */
      if (tvisint(o)) setnumV(o, (lua_Number)intV(o));
      if (tvisint(o+1)) setnumV(o+1, (lua_Number)intV(o+1));
      if (tvisint(o+2)) setnumV(o+2, (lua_Number)intV(o+2));
    }
  }
}